

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderPrecisionTests.cpp
# Opt level: O0

ShaderProgram *
deqp::gles3::Functional::createIntUintPrecisionEvalProgram
          (RenderContext *context,DataType type,Precision precision,char *evalOp,bool isVertexCase)

{
  char *pcVar1;
  char *pcVar2;
  ostream *poVar3;
  ShaderProgram *this;
  char *local_640;
  char *local_628;
  char *local_5e8;
  ostringstream *local_460;
  string local_450;
  string local_430;
  ProgramSources local_410;
  ostringstream *local_340;
  ostringstream *op;
  ostringstream local_328 [8];
  ostringstream frag;
  ostringstream local_1b0 [8];
  ostringstream vtx;
  char *precName;
  char *typeName;
  bool isVertexCase_local;
  char *evalOp_local;
  Precision precision_local;
  DataType type_local;
  RenderContext *context_local;
  
  pcVar1 = glu::getDataTypeName(type);
  pcVar2 = glu::getPrecisionName(precision);
  std::__cxx11::ostringstream::ostringstream(local_1b0);
  std::__cxx11::ostringstream::ostringstream(local_328);
  if (isVertexCase) {
    local_460 = local_1b0;
  }
  else {
    local_460 = local_328;
  }
  local_340 = local_460;
  poVar3 = std::operator<<((ostream *)local_1b0,"#version 300 es\n");
  poVar3 = std::operator<<(poVar3,"in highp vec4 a_position;\n");
  poVar3 = std::operator<<(poVar3,"in ");
  poVar3 = std::operator<<(poVar3,pcVar2);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::operator<<(poVar3,pcVar1);
  poVar3 = std::operator<<(poVar3," a_in0;\n");
  poVar3 = std::operator<<(poVar3,"in ");
  poVar3 = std::operator<<(poVar3,pcVar2);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::operator<<(poVar3,pcVar1);
  std::operator<<(poVar3," a_in1;\n");
  poVar3 = std::operator<<((ostream *)local_328,"#version 300 es\n");
  poVar3 = std::operator<<(poVar3,"layout(location = 0) out ");
  poVar3 = std::operator<<(poVar3,pcVar2);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::operator<<(poVar3,pcVar1);
  std::operator<<(poVar3," o_out;\n");
  if (isVertexCase) {
    poVar3 = std::operator<<((ostream *)local_1b0,"flat out ");
    poVar3 = std::operator<<(poVar3,pcVar2);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,pcVar1);
    std::operator<<(poVar3," v_out;\n");
    poVar3 = std::operator<<((ostream *)local_328,"flat in ");
    poVar3 = std::operator<<(poVar3,pcVar2);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,pcVar1);
    std::operator<<(poVar3," v_out;\n");
  }
  else {
    poVar3 = std::operator<<((ostream *)local_1b0,"flat out ");
    poVar3 = std::operator<<(poVar3,pcVar2);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,pcVar1);
    poVar3 = std::operator<<(poVar3," v_in0;\n");
    poVar3 = std::operator<<(poVar3,"flat out ");
    poVar3 = std::operator<<(poVar3,pcVar2);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,pcVar1);
    std::operator<<(poVar3," v_in1;\n");
    poVar3 = std::operator<<((ostream *)local_328,"flat in ");
    poVar3 = std::operator<<(poVar3,pcVar2);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,pcVar1);
    poVar3 = std::operator<<(poVar3," v_in0;\n");
    poVar3 = std::operator<<(poVar3,"flat in ");
    poVar3 = std::operator<<(poVar3,pcVar2);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,pcVar1);
    std::operator<<(poVar3," v_in1;\n");
  }
  poVar3 = std::operator<<((ostream *)local_1b0,"\nvoid main (void)\n{\n");
  std::operator<<(poVar3,"\tgl_Position = a_position;\n");
  std::operator<<((ostream *)local_328,"\nvoid main (void)\n{\n");
  poVar3 = std::operator<<((ostream *)local_340,"\t");
  poVar3 = std::operator<<(poVar3,pcVar2);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::operator<<(poVar3,pcVar1);
  poVar3 = std::operator<<(poVar3," in0 = ");
  if (isVertexCase) {
    local_5e8 = "a_";
  }
  else {
    local_5e8 = "v_";
  }
  poVar3 = std::operator<<(poVar3,local_5e8);
  poVar3 = std::operator<<(poVar3,"in0;\n");
  poVar3 = std::operator<<(poVar3,"\t");
  poVar3 = std::operator<<(poVar3,pcVar2);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::operator<<(poVar3,pcVar1);
  poVar3 = std::operator<<(poVar3," in1 = ");
  if (isVertexCase) {
    local_628 = "a_";
  }
  else {
    local_628 = "v_";
  }
  poVar3 = std::operator<<(poVar3,local_628);
  std::operator<<(poVar3,"in1;\n");
  poVar3 = std::operator<<((ostream *)local_340,"\t");
  if (isVertexCase) {
    local_640 = "\tv_";
  }
  else {
    local_640 = "\to_";
  }
  local_640 = local_640 + 1;
  poVar3 = std::operator<<(poVar3,local_640);
  poVar3 = std::operator<<(poVar3,"out = ");
  poVar3 = std::operator<<(poVar3,evalOp);
  std::operator<<(poVar3,";\n");
  if (isVertexCase) {
    std::operator<<((ostream *)local_328,"\to_out = v_out;\n");
  }
  else {
    poVar3 = std::operator<<((ostream *)local_1b0,"\tv_in0 = a_in0;\n");
    std::operator<<(poVar3,"\tv_in1 = a_in1;\n");
  }
  std::operator<<((ostream *)local_1b0,"}\n");
  std::operator<<((ostream *)local_328,"}\n");
  this = (ShaderProgram *)operator_new(0xd0);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::str();
  glu::makeVtxFragSources(&local_410,&local_430,&local_450);
  glu::ShaderProgram::ShaderProgram(this,context,&local_410);
  glu::ProgramSources::~ProgramSources(&local_410);
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::ostringstream::~ostringstream(local_328);
  std::__cxx11::ostringstream::~ostringstream(local_1b0);
  return this;
}

Assistant:

static glu::ShaderProgram* createIntUintPrecisionEvalProgram (const glu::RenderContext& context, glu::DataType type, glu::Precision precision, const char* evalOp, bool isVertexCase)
{
	const char*		typeName	= glu::getDataTypeName(type);
	const char*		precName	= glu::getPrecisionName(precision);
	ostringstream	vtx;
	ostringstream	frag;
	ostringstream&	op			= isVertexCase ? vtx : frag;

	vtx << "#version 300 es\n"
		<< "in highp vec4 a_position;\n"
		<< "in " << precName << " " << typeName << " a_in0;\n"
		<< "in " << precName << " " << typeName << " a_in1;\n";
	frag << "#version 300 es\n"
		 << "layout(location = 0) out " << precName << " " << typeName << " o_out;\n";

	if (isVertexCase)
	{
		vtx << "flat out " << precName << " " << typeName << " v_out;\n";
		frag << "flat in " << precName << " " << typeName << " v_out;\n";
	}
	else
	{
		vtx << "flat out " << precName << " " << typeName << " v_in0;\n"
			<< "flat out " << precName << " " << typeName << " v_in1;\n";
		frag << "flat in " << precName << " " << typeName << " v_in0;\n"
			 << "flat in " << precName << " " << typeName << " v_in1;\n";
	}

	vtx << "\nvoid main (void)\n{\n"
		<< "	gl_Position = a_position;\n";
	frag << "\nvoid main (void)\n{\n";

	op << "\t" << precName << " " << typeName << " in0 = " << (isVertexCase ? "a_" : "v_") << "in0;\n"
	   << "\t" << precName << " " << typeName << " in1 = " << (isVertexCase ? "a_" : "v_") << "in1;\n";

	op << "\t" << (isVertexCase ? "v_" : "o_") << "out = " << evalOp << ";\n";

	if (isVertexCase)
	{
		frag << "	o_out = v_out;\n";
	}
	else
	{
		vtx << "	v_in0 = a_in0;\n"
			<< "	v_in1 = a_in1;\n";
	}

	vtx << "}\n";
	frag << "}\n";

	return new glu::ShaderProgram(context, glu::makeVtxFragSources(vtx.str(), frag.str()));
}